

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  double dVar4;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_double> *this_local;
  
  dVar4 = compute_lower_bound();
  this->lower_bound = dVar4;
  dVar4 = compute_upper_bound(this);
  this->upper_bound = dVar4;
  make_init_node_0(this);
  iVar1 = this->b_min;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
           ::back(&this->nodes);
  if ((pvVar3->sumfactor < iVar1) ||
     (pvVar3 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
               ::back(&this->nodes), this->b_max < pvVar3->sumfactor)) {
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    if (this->b_max < pvVar3->sumfactor) {
      pvVar3 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
               ::back(&this->nodes);
      shared_subvector::remove(&this->subvector,(char *)(ulong)pvVar3->variables);
      std::
      vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
      ::pop_back(&this->nodes);
    }
  }
  else {
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    this->upper_bound = pvVar3->sumr;
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    shared_subvector::copy
              (&this->subvector,(EVP_PKEY_CTX *)(ulong)pvVar3->variables,
               (EVP_PKEY_CTX *)(ulong)this->solution);
  }
  make_init_node_1(this);
  iVar1 = this->b_min;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
           ::back(&this->nodes);
  if ((pvVar3->sumfactor < iVar1) ||
     (pvVar3 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
               ::back(&this->nodes), this->b_max < pvVar3->sumfactor)) {
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    if (this->b_max < pvVar3->sumfactor) {
      pvVar3 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
               ::back(&this->nodes);
      shared_subvector::remove(&this->subvector,(char *)(ulong)pvVar3->variables);
      std::
      vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
      ::pop_back(&this->nodes);
    }
  }
  else {
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    this->upper_bound = pvVar3->sumr;
    pvVar3 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
             ::back(&this->nodes);
    shared_subvector::copy
              (&this->subvector,(EVP_PKEY_CTX *)(ulong)pvVar3->variables,
               (EVP_PKEY_CTX *)(ulong)this->solution);
  }
  while (bVar2 = std::
                 vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_double>::node>_>
                 ::empty(&this->nodes), ((bVar2 ^ 0xffU) & 1) != 0) {
    make_next_inequality_node(this);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }